

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcLightSourcePositional::~IfcLightSourcePositional
          (IfcLightSourcePositional *this)

{
  ~IfcLightSourcePositional((IfcLightSourcePositional *)&this[-1].super_IfcLightSource.field_0x50);
  return;
}

Assistant:

IfcLightSourcePositional() : Object("IfcLightSourcePositional") {}